

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BReverbModel.cpp
# Opt level: O2

void __thiscall MT32Emu::BReverbModelImpl<short>::mute(BReverbModelImpl<short> *this)

{
  short *psVar1;
  Bit32u i;
  ulong uVar2;
  
  if (this->allpasses != (AllpassFilter<short> **)0x0) {
    for (uVar2 = 0; uVar2 < this->currentSettings->numberOfAllpasses; uVar2 = uVar2 + 1) {
      psVar1 = (this->allpasses[uVar2]->super_RingBuffer<short>).buffer;
      if (psVar1 != (short *)0x0) {
        memset(psVar1,0,(ulong)(this->allpasses[uVar2]->super_RingBuffer<short>).size * 2);
      }
    }
  }
  if (this->combs != (CombFilter<short> **)0x0) {
    for (uVar2 = 0; uVar2 < this->currentSettings->numberOfCombs; uVar2 = uVar2 + 1) {
      psVar1 = (this->combs[uVar2]->super_RingBuffer<short>).buffer;
      if (psVar1 != (short *)0x0) {
        memset(psVar1,0,(ulong)(this->combs[uVar2]->super_RingBuffer<short>).size * 2);
      }
    }
  }
  return;
}

Assistant:

void mute() {
		if (allpasses != NULL) {
			for (Bit32u i = 0; i < currentSettings.numberOfAllpasses; i++) {
				allpasses[i]->mute();
			}
		}
		if (combs != NULL) {
			for (Bit32u i = 0; i < currentSettings.numberOfCombs; i++) {
				combs[i]->mute();
			}
		}
	}